

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int canwearobj(obj *otmp,long *mask,boolean noisy)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *local_68;
  char *local_50;
  char *local_40;
  char *local_38;
  char *which;
  int err;
  boolean noisy_local;
  long *mask_local;
  obj *otmp_local;
  
  bVar1 = 0;
  if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x05')) {
    local_38 = "cloak";
  }
  else {
    if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x06')) {
      local_40 = "shirt";
    }
    else {
      bVar6 = false;
      if (otmp->oclass == '\x03') {
        bVar6 = objects[otmp->otyp].oc_subtyp == '\0';
      }
      local_40 = (char *)0x0;
      if (bVar6) {
        local_40 = "suit";
      }
    }
    local_38 = local_40;
  }
  if ((((local_38 == (char *)0x0) ||
       ((bVar2 = breakarm(youmonst.data), bVar2 == '\0' &&
        (bVar2 = sliparm(youmonst.data), bVar2 == '\0')))) ||
      ((local_38 == "cloak" && ((youmonst.data)->msize == '\x01')))) ||
     (iVar3 = racial_exception(&youmonst,otmp), 0 < iVar3)) {
    if ((otmp->owornmask & 0x7fU) == 0) {
      iVar3 = welded(uwep);
      if (((iVar3 == 0) ||
          (((uwep->oclass != '\x02' && (uwep->oclass != '\x06')) ||
           ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) == 0)))) ||
         (((otmp->oclass != '\x03' || (objects[otmp->otyp].oc_subtyp != '\0')) &&
          ((otmp->oclass != '\x03' || (objects[otmp->otyp].oc_subtyp != '\x06')))))) {
        if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x02')) {
          if (uarmh == (obj *)0x0) {
            if (((u.umonnum == u.umonster) || (iVar3 = num_horns(youmonst.data), iVar3 < 1)) ||
               (((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) < 8 ||
                (otmp->otyp == 0x3d)))) {
              *mask = 4;
            }
            else {
              if (noisy != '\0') {
                iVar3 = num_horns(youmonst.data);
                pcVar5 = "s";
                if (iVar3 == 1) {
                  pcVar5 = "";
                }
                pline("The %s won\'t fit over your horn%s.","helmet",pcVar5);
              }
              bVar1 = 1;
            }
          }
          else {
            if (noisy != '\0') {
              pcVar5 = an("helmet");
              already_wearing(pcVar5);
            }
            bVar1 = 1;
          }
        }
        else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x01')) {
          if (uarms == (obj *)0x0) {
            if ((uwep == (obj *)0x0) ||
               (((uwep->oclass != '\x02' && (uwep->oclass != '\x06')) ||
                ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) == 0)))) {
              if (u.twoweap == '\0') {
                *mask = 8;
              }
              else {
                if (noisy != '\0') {
                  pline("You cannot wear a shield while wielding two weapons.");
                }
                bVar1 = 1;
              }
            }
            else {
              if (noisy != '\0') {
                if (((uwep->oclass == '\x02') && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
                   (objects[uwep->otyp].oc_subtyp < '\v')) {
                  local_50 = "sword";
                }
                else {
                  local_50 = "weapon";
                  if (uwep->otyp == 0x1c) {
                    local_50 = "axe";
                  }
                }
                pline("You cannot wear a shield while wielding a two-handed %s.",local_50);
              }
              bVar1 = 1;
            }
          }
          else {
            if (noisy != '\0') {
              pcVar5 = an("shield");
              already_wearing(pcVar5);
            }
            bVar1 = 1;
          }
        }
        else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x04')) {
          if (uarmf == (obj *)0x0) {
            if ((u.umonnum == u.umonster) || (((youmonst.data)->mflags1 & 0x80000) == 0)) {
              if ((u.umonnum == u.umonster) || ((youmonst.data)->mlet != '\x1d')) {
                if ((u.utrap == 0) || ((u.utraptype != 0 && (u.utraptype != 4)))) {
                  *mask = 0x20;
                }
                else {
                  if (u.utraptype == 0) {
                    if (noisy != '\0') {
                      pcVar5 = body_part(5);
                      pline("Your %s is trapped!",pcVar5);
                    }
                  }
                  else if (noisy != '\0') {
                    pcVar5 = body_part(5);
                    pcVar5 = makeplural(pcVar5);
                    pcVar4 = surface((int)u.ux,(int)u.uy);
                    pline("Your %s are stuck in the %s!",pcVar5,pcVar4);
                  }
                  bVar1 = 1;
                }
              }
              else {
                if (noisy != '\0') {
                  pline("You have too many hooves to wear %s.","boots");
                }
                bVar1 = 1;
              }
            }
            else {
              if (noisy != '\0') {
                pline("You have no feet...");
              }
              bVar1 = 1;
            }
          }
          else {
            if (noisy != '\0') {
              already_wearing("boots");
            }
            bVar1 = 1;
          }
        }
        else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x03')) {
          if (uarmg == (obj *)0x0) {
            iVar3 = welded(uwep);
            if (iVar3 == 0) {
              *mask = 0x10;
            }
            else {
              if (noisy != '\0') {
                bVar6 = false;
                if ((uwep->oclass == '\x02') &&
                   (bVar6 = false, '\x04' < objects[uwep->otyp].oc_subtyp)) {
                  bVar6 = objects[uwep->otyp].oc_subtyp < '\v';
                }
                pcVar5 = "weapon";
                if (bVar6) {
                  pcVar5 = "sword";
                }
                pline("You cannot wear gloves over your %s.",pcVar5);
              }
              bVar1 = 1;
            }
          }
          else {
            if (noisy != '\0') {
              already_wearing("gloves");
            }
            bVar1 = 1;
          }
        }
        else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x06')) {
          if (((uarm == (obj *)0x0) && (uarmc == (obj *)0x0)) && (uarmu == (obj *)0x0)) {
            *mask = 0x40;
          }
          else {
            if (uarmu == (obj *)0x0) {
              if (noisy != '\0') {
                if ((uarm == (obj *)0x0) || (uarmc != (obj *)0x0)) {
                  local_68 = cloak_simple_name(uarmc);
                }
                else {
                  local_68 = "armor";
                }
                pline("You can\'t wear that over your %s.",local_68);
              }
            }
            else if (noisy != '\0') {
              pcVar5 = an("shirt");
              already_wearing(pcVar5);
            }
            bVar1 = 1;
          }
        }
        else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x05')) {
          if (uarmc == (obj *)0x0) {
            *mask = 2;
          }
          else {
            if (noisy != '\0') {
              pcVar5 = cloak_simple_name(uarmc);
              pcVar5 = an(pcVar5);
              already_wearing(pcVar5);
            }
            bVar1 = 1;
          }
        }
        else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\0')) {
          if (uarmc == (obj *)0x0) {
            if (uarm == (obj *)0x0) {
              *mask = 1;
            }
            else {
              if (noisy != '\0') {
                already_wearing("some armor");
              }
              bVar1 = 1;
            }
          }
          else {
            if (noisy != '\0') {
              pcVar5 = cloak_simple_name(uarmc);
              pline("You cannot wear armor over a %s.",pcVar5);
            }
            bVar1 = 1;
          }
        }
        else {
          if (noisy != '\0') {
            silly_thing("wear",otmp);
          }
          bVar1 = 1;
        }
        otmp_local._4_4_ = (uint)((bVar1 ^ 0xff) & 1);
      }
      else {
        if (noisy != '\0') {
          bVar6 = false;
          if ((uwep->oclass == '\x02') && (bVar6 = false, '\x04' < objects[uwep->otyp].oc_subtyp)) {
            bVar6 = objects[uwep->otyp].oc_subtyp < '\v';
          }
          pcVar5 = "weapon";
          if (bVar6) {
            pcVar5 = "sword";
          }
          pline("You cannot do that while holding your %s.",pcVar5);
        }
        otmp_local._4_4_ = 0;
      }
    }
    else {
      if (noisy != '\0') {
        already_wearing("that");
      }
      otmp_local._4_4_ = 0;
    }
  }
  else {
    if (noisy != '\0') {
      pline("The %s will not fit on your body.",local_38);
    }
    otmp_local._4_4_ = 0;
  }
  return otmp_local._4_4_;
}

Assistant:

int canwearobj(struct obj *otmp, long *mask, boolean noisy)
{
    int err = 0;
    const char *which;

    which = is_cloak(otmp) ? c_cloak :
	    is_shirt(otmp) ? c_shirt :
	    is_suit(otmp) ? c_suit : 0;
    if (which && cantweararm(youmonst.data) &&
	    /* same exception for cloaks as used in m_dowear() */
	    (which != c_cloak || youmonst.data->msize != MZ_SMALL) &&
	    (racial_exception(&youmonst, otmp) < 1)) {
	if (noisy) pline("The %s will not fit on your body.", which);
	return 0;
    } else if (otmp->owornmask & W_ARMOR) {
	if (noisy) already_wearing(c_that_);
	return 0;
    }

    if (welded(uwep) && bimanual(uwep) && (is_suit(otmp) || is_shirt(otmp))) {
	if (noisy)
	    pline("You cannot do that while holding your %s.",
		is_sword(uwep) ? c_sword : c_weapon);
	return 0;
    }

    if (is_helmet(otmp)) {
	if (uarmh) {
	    if (noisy) already_wearing(an(c_helmet));
	    err++;
	} else if (Upolyd && has_horns(youmonst.data) && !is_flimsy(otmp)) {
	    /* (flimsy exception matches polyself handling) */
	    if (noisy)
		pline("The %s won't fit over your horn%s.",
			  c_helmet, plur(num_horns(youmonst.data)));
	    err++;
	} else
	    *mask = W_ARMH;
    } else if (is_shield(otmp)) {
	if (uarms) {
	    if (noisy) already_wearing(an(c_shield));
	    err++;
	} else if (uwep && bimanual(uwep)) {
	    if (noisy) 
		pline("You cannot wear a shield while wielding a two-handed %s.",
		    is_sword(uwep) ? c_sword :
		    (uwep->otyp == BATTLE_AXE) ? c_axe : c_weapon);
	    err++;
	} else if (u.twoweap) {
	    if (noisy)
		pline("You cannot wear a shield while wielding two weapons.");
	    err++;
	} else
	    *mask = W_ARMS;
    } else if (is_boots(otmp)) {
	if (uarmf) {
	    if (noisy) already_wearing(c_boots);
	    err++;
	} else if (Upolyd && slithy(youmonst.data)) {
	    if (noisy) pline("You have no feet...");	/* not body_part(FOOT) */
	    err++;
	} else if (Upolyd && youmonst.data->mlet == S_CENTAUR) {
	    /* break_armor() pushes boots off for centaurs,
	       so don't let dowear() put them back on... */
	    if (noisy) pline("You have too many hooves to wear %s.",
			     c_boots);	/* makeplural(body_part(FOOT)) yields
					   "rear hooves" which sounds odd */
	    err++;
	} else if (u.utrap && (u.utraptype == TT_BEARTRAP ||
				u.utraptype == TT_INFLOOR)) {
	    if (u.utraptype == TT_BEARTRAP) {
		if (noisy) pline("Your %s is trapped!", body_part(FOOT));
	    } else {
		if (noisy) pline("Your %s are stuck in the %s!",
				makeplural(body_part(FOOT)),
				surface(u.ux, u.uy));
	    }
	    err++;
	} else
	    *mask = W_ARMF;
    } else if (is_gloves(otmp)) {
	if (uarmg) {
	    if (noisy) already_wearing(c_gloves);
	    err++;
	} else if (welded(uwep)) {
	    if (noisy) pline("You cannot wear gloves over your %s.",
			   is_sword(uwep) ? c_sword : c_weapon);
	    err++;
	} else
	    *mask = W_ARMG;
    } else if (is_shirt(otmp)) {
	if (uarm || uarmc || uarmu) {
	    if (uarmu) {
		if (noisy) already_wearing(an(c_shirt));
	    } else {
		if (noisy) pline("You can't wear that over your %s.",
			           (uarm && !uarmc) ? c_armor : cloak_simple_name(uarmc));
	    }
	    err++;
	} else
	    *mask = W_ARMU;
    } else if (is_cloak(otmp)) {
	if (uarmc) {
	    if (noisy) already_wearing(an(cloak_simple_name(uarmc)));
	    err++;
	} else
	    *mask = W_ARMC;
    } else if (is_suit(otmp)) {
	if (uarmc) {
	    if (noisy) pline("You cannot wear armor over a %s.", cloak_simple_name(uarmc));
	    err++;
	} else if (uarm) {
	    if (noisy) already_wearing("some armor");
	    err++;
	} else
	    *mask = W_ARM;
    } else {
	/* getobj can't do this after setting its allow_all flag; that
	   happens if you have armor for slots that are covered up or
	   extra armor for slots that are filled */
	if (noisy) silly_thing("wear", otmp);
	err++;
    }
    return !err;
}